

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh.cxx
# Opt level: O3

void __thiscall read_surfmap::operator()(read_surfmap *this,xr_surfmap **_smap,xr_reader *r)

{
  xr_object *this_00;
  uint *puVar1;
  uint8_t *puVar2;
  xr_surfmap *pxVar3;
  char *__s;
  xr_surface *pxVar4;
  ulong __n;
  allocator<char> local_49;
  string local_48;
  
  pxVar3 = (xr_surfmap *)operator_new(0x20);
  pxVar3->surface = (xr_surface *)0x0;
  (pxVar3->faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pxVar3->faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pxVar3->faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *_smap = pxVar3;
  __s = xray_re::xr_reader::skip_sz(r);
  this_00 = this->object;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,__s,&local_49);
  pxVar4 = xray_re::xr_object::find_surface(this_00,&local_48);
  pxVar3->surface = pxVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  puVar1 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
  __n = (ulong)*puVar1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&pxVar3->faces,__n);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pxVar3->faces,puVar1 + 1,
             puVar1 + __n + 1);
  puVar2 = (r->field_2).m_p;
  (r->field_2).m_p = puVar2 + __n * 4;
  if (puVar2 + __n * 4 <= r->m_end) {
    return;
  }
  __assert_fail("m_p <= m_end",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.h"
                ,0x7c,"void xray_re::xr_reader::advance(size_t)");
}

Assistant:

void operator()(xr_surfmap*& _smap, xr_reader& r) const {
		xr_surfmap* smap = new xr_surfmap;
		_smap = smap;
		const char* name = r.skip_sz();
		smap->surface = object.find_surface(name);
		r.r_seq(r.r_u32(), smap->faces);
	}